

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_mesh_tasks(CompilerGLSL *this,SPIRBlock *block)

{
  uint32_t uVar1;
  uint32_t id;
  undefined1 local_88 [48];
  undefined1 local_58 [32];
  SPIRBlock *local_18;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  local_18 = block;
  block_local = (SPIRBlock *)this;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->mesh);
  id = (uint32_t)this;
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)&stack0xffffffffffffffc8,id,SUB41(uVar1,0));
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 1));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_58,id,SUB41(uVar1,0));
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_18->mesh).groups + 2));
  to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_88,id,SUB41(uVar1,0));
  statement<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
            (this,(char (*) [18])"EmitMeshTasksEXT(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc8,(char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [3])0x5fe6df,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (char (*) [3])0x5e9b6f);
  ::std::__cxx11::string::~string((string *)local_88);
  ::std::__cxx11::string::~string((string *)local_58);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void CompilerGLSL::emit_mesh_tasks(SPIRBlock &block)
{
	statement("EmitMeshTasksEXT(",
	          to_unpacked_expression(block.mesh.groups[0]), ", ",
	          to_unpacked_expression(block.mesh.groups[1]), ", ",
	          to_unpacked_expression(block.mesh.groups[2]), ");");
}